

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_loader.c
# Opt level: O0

void image_load(char *filename,uchar *image_data,int *image_width,int *image_height)

{
  int iVar1;
  list *local_40;
  list *loader_entry;
  loader_t *loader;
  int *piStack_28;
  char magic [4];
  int *image_height_local;
  int *image_width_local;
  uchar *image_data_local;
  char *filename_local;
  
  loader_entry = (list *)0x0;
  piStack_28 = image_height;
  if (filename != (char *)0x0) {
    iVar1 = magic_read(filename,(char *)((long)&loader + 4),4);
    if (iVar1 != -1) {
      for (local_40 = loader_list.next; loader_entry = (list *)0x0, local_40 != &loader_list;
          local_40 = local_40->next) {
        loader_entry = (list *)&local_40[-3].prev;
        iVar1 = memcmp((void *)((long)&loader + 4),*(list **)loader_entry,
                       (long)*(int *)&local_40[-2].next);
        if (iVar1 == 0) break;
      }
    }
    if ((loader_entry != (list *)0x0) &&
       (iVar1 = image_read(filename,(loader_t *)loader_entry,image_data,image_width,piStack_28),
       iVar1 == -1)) {
      loader_entry = (list *)0x0;
    }
  }
  if (loader_entry == (list *)0x0) {
    *image_width = 0x200;
    *piStack_28 = 0x200;
    if (image_data != (uchar *)0x0) {
      memcpy(image_data,tux_image.pixel_data,0x100000);
    }
  }
  return;
}

Assistant:

void image_load(char *filename, unsigned char *image_data, int *image_width, int *image_height)
{
  char magic[4];
  loader_t *loader = NULL;
  struct list *loader_entry = NULL;

  if (filename) {
    if (magic_read(filename, magic, sizeof(magic)) != -1) {
      LIST_FOR_EACH(loader_entry, &loader_list) {
        loader = LIST_ENTRY(loader_entry, loader_t, entry);
        if (!memcmp(magic, loader->magic, loader->magic_size)) {
          break;
        }
        loader = NULL;
      }
    }

    if (loader) {
      if (image_read(filename, loader, image_data, image_width, image_height) == -1) {
        loader = NULL;
      }
    }
  }

  if (!loader) {
    *image_width = tux_image.width;
    *image_height = tux_image.height;
    if (image_data) {
      memcpy(image_data, (unsigned char *)tux_image.pixel_data, tux_image.width * tux_image.height * 4);
    }
  }
}